

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::SocketWriter::SocketWriter
          (SocketWriter *this,string *host,string *port)

{
  (this->super_AbstractSocketWriter)._vptr_AbstractSocketWriter =
       (_func_int **)&PTR__SocketWriter_00156ab8;
  this->sockfd_ = -1;
  std::__cxx11::string::string((string *)&this->host_name_,(string *)host);
  std::__cxx11::string::string((string *)&this->port_num_,(string *)port);
  MakeConnection(this);
  return;
}

Assistant:

SocketWriter(const string& host, const string& port)
        : sockfd_(-1), host_name_(host), port_num_(port) {
      MakeConnection();
    }